

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

bool __thiscall PStruct::ReadFields(PStruct *this,FSerializer *ar,void *addr)

{
  PSymbol *pPVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  byte local_61;
  FName local_3c;
  DObject *local_38;
  PSymbol *sym;
  char *label;
  bool foundsomething;
  void *pvStack_20;
  bool readsomething;
  void *addr_local;
  FSerializer *ar_local;
  PStruct *this_local;
  
  label._7_1_ = 0;
  label._6_1_ = 0;
  pvStack_20 = addr;
  addr_local = ar;
  ar_local = (FSerializer *)this;
  while (sym = (PSymbol *)FSerializer::GetKey((FSerializer *)addr_local), sym != (PSymbol *)0x0) {
    label._6_1_ = 1;
    FName::FName(&local_3c,(char *)sym,true);
    local_38 = (DObject *)
               PSymbolTable::FindSymbol
                         (&(this->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                          &local_3c,true);
    pPVar1 = sym;
    if (local_38 == (DObject *)0x0) {
      pcVar4 = FName::GetChars(&(this->super_PNamedType).TypeName);
      DPrintf(1,"Cannot find field %s in %s\n",pPVar1,pcVar4);
    }
    else {
      bVar2 = DObject::IsKindOf(local_38,PField::RegistrationInfo.MyClass);
      pPVar1 = sym;
      if (bVar2) {
        bVar3 = (**(code **)(*(long *)&((local_38[1].Class)->super_PNativeStruct).super_PStruct.
                                       super_PNamedType.super_PCompoundType.super_PType.
                                       super_PTypeBase.super_DObject + 0x50))
                          (local_38[1].Class,addr_local,0,
                           (long)pvStack_20 + (long)local_38[1]._vptr_DObject);
        label._7_1_ = (label._7_1_ & 1) != 0 || (bVar3 & 1) != 0;
      }
      else {
        pcVar4 = FName::GetChars(&(this->super_PNamedType).TypeName);
        DPrintf(1,"Symbol %s in %s is not a field\n",pPVar1,pcVar4);
      }
    }
  }
  local_61 = 1;
  if ((label._7_1_ & 1) == 0) {
    local_61 = label._6_1_ ^ 0xff;
  }
  return (bool)(local_61 & 1);
}

Assistant:

bool PStruct::ReadFields(FSerializer &ar, void *addr) const
{
	bool readsomething = false;
	bool foundsomething = false;
	const char *label;
	while ((label = ar.GetKey()))
	{
		foundsomething = true;

		const PSymbol *sym = Symbols.FindSymbol(FName(label, true), true);
		if (sym == NULL)
		{
			DPrintf(DMSG_ERROR, "Cannot find field %s in %s\n",
				label, TypeName.GetChars());
		}
		else if (!sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			DPrintf(DMSG_ERROR, "Symbol %s in %s is not a field\n",
				label, TypeName.GetChars());
		}
		else
		{
			readsomething |= static_cast<const PField *>(sym)->Type->ReadValue(ar, nullptr,
				(BYTE *)addr + static_cast<const PField *>(sym)->Offset);
		}
	}
	return readsomething || !foundsomething;
}